

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

void convertArrayToMap(QCborContainerPrivate **array)

{
  ValueFlags VVar1;
  qsizetype qVar2;
  Element *pEVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  qsizetype i_1;
  qsizetype i;
  QCborContainerPrivate *map;
  qsizetype size;
  const_iterator src;
  iterator dst;
  QCborContainerPrivate *in_stack_ffffffffffffff68;
  QList<QtCbor::Element> *in_stack_ffffffffffffff70;
  Element *in_stack_ffffffffffffff78;
  uint7 in_stack_ffffffffffffff80;
  undefined1 uVar4;
  Element *local_78;
  long local_70;
  undefined1 local_4c [4];
  anon_union_8_2_4ee71171_for_Element_0 local_48;
  undefined8 local_40;
  const_iterator local_38;
  iterator local_30;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = true;
  if (*in_RDI != 0) {
    uVar4 = QList<QtCbor::Element>::isEmpty((QList<QtCbor::Element> *)0x478dbf);
  }
  if ((bool)uVar4 == false) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)(ulong)in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(char *)in_stack_ffffffffffffff68);
    QMessageLogger::warning(&local_28,"Using CBOR array as map forced conversion");
    qVar2 = QList<QtCbor::Element>::size((QList<QtCbor::Element> *)(*in_RDI + 0x28));
    QCborContainerPrivate::detach(in_stack_ffffffffffffff68,0x478e27);
    QList<QtCbor::Element>::resize
              ((QList<QtCbor::Element> *)CONCAT17(uVar4,in_stack_ffffffffffffff80),
               (qsizetype)in_stack_ffffffffffffff78);
    local_30.i = (Element *)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QtCbor::Element>::begin(in_stack_ffffffffffffff70);
    local_38.i = (Element *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = QList<QtCbor::Element>::constBegin(in_stack_ffffffffffffff70);
    local_70 = qVar2;
    while (local_70 = local_70 + -1, -1 < local_70) {
      in_stack_ffffffffffffff78 =
           QList<QtCbor::Element>::const_iterator::operator[](&local_38,local_70);
      pEVar3 = QList<QtCbor::Element>::iterator::operator[](&local_30,local_70 * 2 + 1);
      pEVar3->field_0 = in_stack_ffffffffffffff78->field_0;
      VVar1.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
           (in_stack_ffffffffffffff78->flags).
           super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
      pEVar3->type = in_stack_ffffffffffffff78->type;
      pEVar3->flags =
           (ValueFlags)
           VVar1.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    }
    for (local_78 = (Element *)0x0; (long)local_78 < qVar2;
        local_78 = (Element *)((long)&local_78->field_0 + 1)) {
      pEVar3 = local_78;
      memset(local_4c,0,4);
      QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x478f20);
      QtCbor::Element::Element
                (pEVar3,(qint64)in_stack_ffffffffffffff68,Integer,
                 (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)
                 SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
      pEVar3 = QList<QtCbor::Element>::iterator::operator[](&local_30,(long)local_78 << 1);
      pEVar3->field_0 = local_48;
      pEVar3->type = (undefined4)local_40;
      pEVar3->flags = (ValueFlags)local_40._4_4_;
    }
    assignContainer((QCborContainerPrivate **)in_stack_ffffffffffffff68,
                    (QCborContainerPrivate *)0x478f77);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void convertArrayToMap(QCborContainerPrivate *&array)
{
    if (Q_LIKELY(!array || array->elements.isEmpty()))
        return;

    // The Q_LIKELY and the qWarning mark the rest of this function as unlikely
    qWarning("Using CBOR array as map forced conversion");

    qsizetype size = array->elements.size();
    QCborContainerPrivate *map = QCborContainerPrivate::detach(array, size * 2);
    map->elements.resize(size * 2);

    // this may be an in-place copy, so we have to do it from the end
    auto dst = map->elements.begin();
    auto src = array->elements.constBegin();
    for (qsizetype i = size - 1; i >= 0; --i) {
        Q_ASSERT(src->type != QCborValue::Invalid);
        dst[i * 2 + 1] = src[i];
    }
    for (qsizetype i = 0; i < size; ++i)
        dst[i * 2] = { i, QCborValue::Integer };

    // update reference counts
    assignContainer(array, map);
}